

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1b_moving_median.cpp
# Opt level: O3

int main(void)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  istream *piVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  const_iterator __position;
  _Base_ptr p_Var10;
  long lVar11;
  ulong uVar12;
  size_t w;
  size_t n;
  vector<int,_std::allocator<int>_> v;
  multiset<int,_std::less<int>,_std::allocator<int>_> s;
  ulong local_88;
  size_type local_80;
  vector<int,_std::allocator<int>_> local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x1051a8) = 0;
  piVar5 = std::istream::_M_extract<unsigned_long>((ulong *)&std::cin);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar5);
  std::vector<int,_std::allocator<int>_>::vector(&local_78,local_80,(allocator_type *)&local_60);
  if (local_80 != 0) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      std::istream::operator>>
                ((istream *)&std::cin,
                 (int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar11));
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 4;
    } while (uVar12 < local_80);
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (local_88 == 0xffffffffffffffff) {
    uVar12 = 0xffffffffffffffff;
    uVar9 = 0x7fffffffffffffff;
    p_Var6 = &p_Var1->_M_header;
  }
  else {
    lVar11 = 0;
    uVar12 = 0;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_equal<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,
                 (int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar11));
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 4;
    } while (uVar12 < local_88 + 1);
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar12 = local_88;
    if (local_88 < 2) goto LAB_001013e3;
    uVar9 = local_88 >> 1;
  }
  do {
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    uVar9 = uVar9 - 1;
  } while (uVar9 != 0);
LAB_001013e3:
  if (local_80 != uVar12) {
    uVar12 = 0;
    do {
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var6[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      __position._M_node = &p_Var1->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        iVar2 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12];
        p_Var6 = &p_Var1->_M_header;
        p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          p_Var8 = p_Var4;
          p_Var10 = p_Var6;
          _Var3 = p_Var8[1]._M_color;
          p_Var6 = p_Var8;
          if ((int)_Var3 < iVar2) {
            p_Var6 = p_Var10;
          }
          p_Var4 = (&p_Var8->_M_left)[(int)_Var3 < iVar2];
        } while ((&p_Var8->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var6 != p_Var1) {
          if ((int)_Var3 < iVar2) {
            p_Var8 = p_Var10;
          }
          __position._M_node = p_Var6;
          if (iVar2 < (int)p_Var8[1]._M_color) {
            __position._M_node = &p_Var1->_M_header;
          }
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_60,__position);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_equal<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,
                 local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar12 + local_88 + 1);
      p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (1 < local_88) {
        uVar9 = local_88 >> 1;
        do {
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < local_80 - local_88);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    size_t n,w;
    cin >> n >> w;
    vector<int> v(n);
    for (size_t i = 0; i < n; ++i) {
        cin >> v[i];
    }
    multiset<int> s;
    for (size_t i = 0; i < w+1; ++i) {
        s.insert(v[i]);
    }
    auto it = s.begin();
    for (size_t i = 0; i < w/2; ++i) {
        ++it;
    }
    for (size_t i = 0; i < n-w; ++i) {
        cout << *it << " ";
        auto tmp = s.find(v[i]);
        s.erase(tmp);
        s.insert(v[i+w+1]);
        it = s.begin();
        for (size_t i = 0; i < w/2; ++i) {
            ++it;
        }
    }
    cout << endl;
}